

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O3

void xmlDtdDumpOutput(xmlSaveCtxtPtr ctxt,xmlDtdPtr dtd)

{
  xmlOutputBufferPtr out;
  int iVar1;
  char *data;
  int iVar2;
  _xmlNode *cur;
  
  if ((ctxt == (xmlSaveCtxtPtr)0x0 || dtd == (xmlDtdPtr)0x0) ||
     (out = ctxt->buf, out == (xmlOutputBufferPtr)0x0)) {
    return;
  }
  xmlOutputBufferWrite(out,10,"<!DOCTYPE ");
  xmlOutputBufferWriteString(out,(char *)dtd->name);
  if (dtd->ExternalID == (xmlChar *)0x0) {
    if (dtd->SystemID == (xmlChar *)0x0) goto LAB_0016faa6;
    xmlOutputBufferWrite(out,8," SYSTEM ");
  }
  else {
    xmlOutputBufferWrite(out,8," PUBLIC ");
    xmlOutputBufferWriteQuotedString(out,dtd->ExternalID);
    xmlOutputBufferWrite(out,1," ");
  }
  xmlOutputBufferWriteQuotedString(out,dtd->SystemID);
LAB_0016faa6:
  if ((((dtd->entities == (void *)0x0) && (dtd->elements == (void *)0x0)) &&
      (dtd->attributes == (void *)0x0)) &&
     ((dtd->notations == (void *)0x0 && (dtd->pentities == (void *)0x0)))) {
    data = ">";
    iVar2 = 1;
  }
  else {
    xmlOutputBufferWrite(out,3," [\n");
    if (((xmlHashTablePtr)dtd->notations != (xmlHashTablePtr)0x0) &&
       ((dtd->doc == (_xmlDoc *)0x0 || (dtd->doc->intSubset == dtd)))) {
      xmlHashScan((xmlHashTablePtr)dtd->notations,xmlBufDumpNotationDeclScan,out);
    }
    iVar2 = ctxt->level;
    iVar1 = ctxt->format;
    ctxt->level = -1;
    ctxt->format = 0;
    for (cur = dtd->children; cur != (xmlNodePtr)0x0; cur = cur->next) {
      xmlNodeDumpOutputInternal(ctxt,cur);
    }
    ctxt->level = iVar2;
    ctxt->format = iVar1;
    data = "]>";
    iVar2 = 2;
  }
  xmlOutputBufferWrite(out,iVar2,data);
  return;
}

Assistant:

static void
xmlDtdDumpOutput(xmlSaveCtxtPtr ctxt, xmlDtdPtr dtd) {
    xmlOutputBufferPtr buf;
    xmlNodePtr cur;
    int format, level;

    if (dtd == NULL) return;
    if ((ctxt == NULL) || (ctxt->buf == NULL))
        return;
    buf = ctxt->buf;
    xmlOutputBufferWrite(buf, 10, "<!DOCTYPE ");
    xmlOutputBufferWriteString(buf, (const char *)dtd->name);
    if (dtd->ExternalID != NULL) {
	xmlOutputBufferWrite(buf, 8, " PUBLIC ");
	xmlOutputBufferWriteQuotedString(buf, dtd->ExternalID);
	xmlOutputBufferWrite(buf, 1, " ");
	xmlOutputBufferWriteQuotedString(buf, dtd->SystemID);
    }  else if (dtd->SystemID != NULL) {
	xmlOutputBufferWrite(buf, 8, " SYSTEM ");
	xmlOutputBufferWriteQuotedString(buf, dtd->SystemID);
    }
    if ((dtd->entities == NULL) && (dtd->elements == NULL) &&
        (dtd->attributes == NULL) && (dtd->notations == NULL) &&
	(dtd->pentities == NULL)) {
	xmlOutputBufferWrite(buf, 1, ">");
	return;
    }
    xmlOutputBufferWrite(buf, 3, " [\n");
    /*
     * Dump the notations first they are not in the DTD children list
     * Do this only on a standalone DTD or on the internal subset though.
     */
    if ((dtd->notations != NULL) && ((dtd->doc == NULL) ||
        (dtd->doc->intSubset == dtd))) {
        xmlBufDumpNotationTable(buf, (xmlNotationTablePtr) dtd->notations);
    }
    format = ctxt->format;
    level = ctxt->level;
    ctxt->format = 0;
    ctxt->level = -1;
    for (cur = dtd->children; cur != NULL; cur = cur->next) {
        xmlNodeDumpOutputInternal(ctxt, cur);
    }
    ctxt->format = format;
    ctxt->level = level;
    xmlOutputBufferWrite(buf, 2, "]>");
}